

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf2yaml.cpp
# Opt level: O0

void dumpDebugStrings(DWARFContext *DCtx,Data *Y)

{
  int iVar1;
  DWARFObject *pDVar2;
  undefined4 extraout_var;
  size_t sVar3;
  undefined1 local_48 [8];
  pair<llvm::StringRef,_llvm::StringRef> SymbolPair;
  StringRef RemainingTable;
  Data *Y_local;
  DWARFContext *DCtx_local;
  
  pDVar2 = llvm::DWARFContext::getDWARFObj(DCtx);
  iVar1 = (*pDVar2->_vptr_DWARFObject[0x11])();
  SymbolPair.second.Length = CONCAT44(extraout_var,iVar1);
  while( true ) {
    sVar3 = llvm::StringRef::size((StringRef *)&SymbolPair.second.Length);
    if (sVar3 == 0) break;
    llvm::StringRef::split
              ((pair<llvm::StringRef,_llvm::StringRef> *)local_48,
               (StringRef *)&SymbolPair.second.Length,'\0');
    SymbolPair.second.Length = SymbolPair.first.Length;
    std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back
              (&Y->DebugStrings,(value_type *)local_48);
  }
  return;
}

Assistant:

void dumpDebugStrings(DWARFContext &DCtx, DWARFYAML::Data &Y) {
  StringRef RemainingTable = DCtx.getDWARFObj().getStrSection();
  while (RemainingTable.size() > 0) {
    auto SymbolPair = RemainingTable.split('\0');
    RemainingTable = SymbolPair.second;
    Y.DebugStrings.push_back(SymbolPair.first);
  }
}